

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O3

int __thiscall
anaPlanner::ComputeHeuristic
          (anaPlanner *this,CMDPSTATE *MDPstate,anaSearchStateSpace_t *pSearchStateSpace)

{
  DiscreteSpaceInformation *pDVar1;
  int iVar2;
  
  pDVar1 = (this->super_SBPLPlanner).environment_;
  iVar2 = (*pDVar1->_vptr_DiscreteSpaceInformation[(ulong)(this->bforwardsearch ^ 1) + 3])
                    (pDVar1,(ulong)(uint)MDPstate->StateID);
  return iVar2;
}

Assistant:

int anaPlanner::ComputeHeuristic(CMDPSTATE* MDPstate, anaSearchStateSpace_t* pSearchStateSpace)
{
    //compute heuristic for search

    if (bforwardsearch) {

#if MEM_CHECK == 1
        //int WasEn = DisableMemCheck();
#endif

        //forward search: heur = distance from state to searchgoal which is Goal anaState
        int retv = environment_->GetGoalHeuristic(MDPstate->StateID);

#if MEM_CHECK == 1
        //if (WasEn)
        //	EnableMemCheck();
#endif

        return retv;

    }
    else {
        //backward search: heur = distance from searchgoal to state
        return environment_->GetStartHeuristic(MDPstate->StateID);
    }
}